

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O3

bool __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x00'>::has_label_value
          (basic_dynamic_counter<long,_(unsigned_char)__x00_> *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer psVar2;
  bool bVar3;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
  map;
  anon_class_1_0_00000001 local_39;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
  local_38;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::metric_pair>,ylt::util::map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,0ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,0ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::my_hash<137ul>>::copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::metric_pair>>()const::_lambda(auto:1&)_1_>
            (&local_38,
             &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>).map_,
             &local_39);
  if (local_38.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_38.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    do {
      psVar2 = local_38.
               super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      pbVar1 = std::
               __find_if<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (0,0,value);
      bVar3 = pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar3) break;
      local_38.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar2;
    } while (psVar2 != local_38.
                       super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair>_>_>
  ::~vector(&local_38);
  return bVar3;
}

Assistant:

bool has_label_value(const std::string &value) override {
    auto map = Base::copy();
    for (auto &e : map) {
      auto &label_value = e->label;
      if (auto it = std::find(label_value.begin(), label_value.end(), value);
          it != label_value.end()) {
        return true;
      }
    }

    return false;
  }